

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O1

void duckdb::TemplatedLoopCombineHash<true,duckdb::interval_t>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  hash_t hVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar10;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar11;
  interval_t val;
  interval_t val_00;
  interval_t val_01;
  interval_t val_02;
  interval_t val_03;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (hashes->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (ulong *)hashes->data;
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      val_00.micros = (int64_t)rsel;
      val_00._0_8_ = *(undefined8 *)(input->data + 8);
      uVar5 = Hash<duckdb::interval_t>(*(duckdb **)input->data,val_00);
    }
    else {
      uVar5 = 0xbf58476d1ce4e5b9;
    }
    uVar10 = *puVar1;
    *puVar1 = (uVar10 >> 0x20 ^ uVar10) * -0x2917014799a6026d ^ uVar5;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (hashes->vector_type == CONSTANT_VECTOR) {
      uVar5 = *(ulong *)hashes->data;
      Vector::SetVectorType(hashes,FLAT_VECTOR);
      pdVar3 = hashes->data;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar4 = (local_78.sel)->sel_vector;
          uVar11 = 0;
          uVar10 = extraout_RDX_00;
          do {
            uVar7 = uVar11;
            if (rsel->sel_vector != (sel_t *)0x0) {
              uVar7 = (ulong)rsel->sel_vector[uVar11];
            }
            uVar8 = uVar7;
            if (psVar4 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar4[uVar7];
            }
            val_03.micros = uVar10;
            val_03._0_8_ = *(undefined8 *)(local_78.data + uVar8 * 0x10 + 8);
            hVar9 = Hash<duckdb::interval_t>(*(duckdb **)(local_78.data + uVar8 * 0x10),val_03);
            *(hash_t *)(pdVar3 + uVar7 * 8) = hVar9 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
            uVar11 = uVar11 + 1;
            uVar10 = extraout_RDX_02;
          } while (count != uVar11);
        }
      }
      else if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar11 = 0;
        uVar10 = extraout_RDX_00;
        do {
          uVar7 = uVar11;
          if (rsel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)rsel->sel_vector[uVar11];
          }
          uVar8 = uVar7;
          if (psVar4 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar4[uVar7];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_013b00a6:
            val.micros = uVar10;
            val._0_8_ = *(undefined8 *)(local_78.data + uVar8 * 0x10 + 8);
            uVar6 = Hash<duckdb::interval_t>(*(duckdb **)(local_78.data + uVar8 * 0x10),val);
            uVar10 = extraout_RDX_01;
          }
          else {
            uVar10 = uVar8 >> 6;
            uVar6 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10]
                 >> (uVar8 & 0x3f) & 1) != 0) goto LAB_013b00a6;
          }
          *(ulong *)(pdVar3 + uVar7 * 8) = uVar6 ^ (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          uVar11 = uVar11 + 1;
        } while (count != uVar11);
      }
    }
    else {
      pdVar3 = hashes->data;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar4 = (local_78.sel)->sel_vector;
          uVar10 = 0;
          uVar5 = extraout_RDX;
          do {
            uVar11 = uVar10;
            if (rsel->sel_vector != (sel_t *)0x0) {
              uVar11 = (ulong)rsel->sel_vector[uVar10];
            }
            uVar7 = uVar11;
            if (psVar4 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar4[uVar11];
            }
            val_02.micros = uVar5;
            val_02._0_8_ = *(undefined8 *)(local_78.data + uVar7 * 0x10 + 8);
            hVar9 = Hash<duckdb::interval_t>(*(duckdb **)(local_78.data + uVar7 * 0x10),val_02);
            uVar5 = (*(ulong *)(pdVar3 + uVar11 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar11 * 8)) *
                    -0x2917014799a6026d ^ hVar9;
            *(ulong *)(pdVar3 + uVar11 * 8) = uVar5;
            uVar10 = uVar10 + 1;
          } while (count != uVar10);
        }
      }
      else if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar10 = 0;
        uVar5 = extraout_RDX;
        do {
          uVar11 = uVar10;
          if (rsel->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)rsel->sel_vector[uVar10];
          }
          uVar7 = uVar11;
          if (psVar4 != (sel_t *)0x0) {
            uVar7 = (ulong)psVar4[uVar11];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_013b016d:
            val_01.micros = uVar5;
            val_01._0_8_ = *(undefined8 *)(local_78.data + uVar7 * 0x10 + 8);
            uVar8 = Hash<duckdb::interval_t>(*(duckdb **)(local_78.data + uVar7 * 0x10),val_01);
          }
          else {
            uVar5 = uVar7 >> 6;
            uVar8 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5]
                 >> (uVar7 & 0x3f) & 1) != 0) goto LAB_013b016d;
          }
          uVar5 = (*(ulong *)(pdVar3 + uVar11 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar11 * 8)) *
                  -0x2917014799a6026d ^ uVar8;
          *(ulong *)(pdVar3 + uVar11 * 8) = uVar5;
          uVar10 = uVar10 + 1;
        } while (count != uVar10);
      }
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}